

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void replace_defined(c2m_ctx_t c2m_ctx,VARR_token_t *expr_buffer)

{
  ulong ix;
  pre_ctx *ppVar1;
  int iVar2;
  size_t sVar3;
  token_t ptVar4;
  token_t ptVar5;
  char *repr;
  int iVar6;
  ulong ix_00;
  ulong ix_01;
  ulong ix_02;
  macro_t tab_macro;
  macro local_50;
  
  ppVar1 = c2m_ctx->pre_ctx;
  ix_02 = 1;
  iVar6 = 0;
  do {
    ix = ix_02 - 1;
    sVar3 = VARR_token_tlength(expr_buffer);
    if (sVar3 <= ix) {
      return;
    }
    ptVar4 = VARR_token_tget(expr_buffer,ix);
    if ((*(short *)ptVar4 == 0x103) && (iVar2 = strcmp(ptVar4->repr,"defined"), iVar2 == 0)) {
      sVar3 = VARR_token_tlength(expr_buffer);
      ix_01 = ix_02;
      if ((ix_02 < sVar3) && (ptVar5 = VARR_token_tget(expr_buffer,ix_02), *(short *)ptVar5 == 0x20)
         ) {
        ix_01 = ix_02 + 1;
      }
      if (ix_01 < sVar3) {
        ptVar5 = VARR_token_tget(expr_buffer,ix_01);
        if (*(short *)ptVar5 == 0x103) {
LAB_001624e8:
          local_50.id = ptVar5;
          iVar2 = HTAB_macro_t_do(ppVar1->macro_tab,&local_50,HTAB_FIND,&tab_macro);
          repr = "0";
          if (iVar2 != 0) {
            repr = "1";
          }
          ptVar4 = new_token(c2m_ctx,ptVar4->pos,repr,0x100,N_IGNORE);
          VARR_token_tset(expr_buffer,ix,ptVar4);
          del_tokens(expr_buffer,(int)ix_02,(int)ix_01 + iVar6);
        }
        else {
          ptVar5 = VARR_token_tget(expr_buffer,ix_01);
          if (*(short *)ptVar5 == 0x28) {
            ix_00 = ix_01 + 1;
            if ((ix_00 < sVar3) &&
               (ptVar5 = VARR_token_tget(expr_buffer,ix_00), *(short *)ptVar5 == 0x20)) {
              ix_00 = ix_01 + 2;
            }
            if ((ix_00 < sVar3) &&
               (ptVar5 = VARR_token_tget(expr_buffer,ix_00), *(short *)ptVar5 == 0x103)) {
              ix_01 = ix_00 + 1;
              if ((ix_01 < sVar3) &&
                 (ptVar5 = VARR_token_tget(expr_buffer,ix_01), *(short *)ptVar5 == 0x20)) {
                ix_01 = ix_00 + 2;
              }
              if ((ix_01 < sVar3) &&
                 (ptVar5 = VARR_token_tget(expr_buffer,ix_01), *(short *)ptVar5 == 0x29)) {
                ptVar5 = VARR_token_tget(expr_buffer,ix_00);
                goto LAB_001624e8;
              }
            }
          }
        }
      }
    }
    ix_02 = ix_02 + 1;
    iVar6 = iVar6 + -1;
  } while( true );
}

Assistant:

static void replace_defined (c2m_ctx_t c2m_ctx, VARR (token_t) * expr_buffer) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  size_t i, j, k, len;
  token_t t, id;
  const char *res;
  struct macro macro_struct;
  macro_t tab_macro;

  for (i = 0; i < VARR_LENGTH (token_t, expr_buffer); i++) {
    /* Change defined ident and defined (ident) */
    t = VARR_GET (token_t, expr_buffer, i);
    if (t->code == T_ID && strcmp (t->repr, "defined") == 0) {
      j = i + 1;
      len = VARR_LENGTH (token_t, expr_buffer);
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len) continue;
      if ((id = VARR_GET (token_t, expr_buffer, j))->code == T_ID) {
        macro_struct.id = id;
        res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
        VARR_SET (token_t, expr_buffer, i,
                  new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
        del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
        continue;
      }
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != '(') continue;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != T_ID) continue;
      k = j;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != ')') continue;
      macro_struct.id = VARR_GET (token_t, expr_buffer, k);
      res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
      VARR_SET (token_t, expr_buffer, i,
                new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
      del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
    }
  }
}